

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O3

void anon_unknown.dwarf_2052c5::readFirstPart(string *fn)

{
  int pixelType;
  char *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  uint *puVar12;
  _Base_ptr p_Var13;
  size_t sVar14;
  Box2i b2;
  DeepScanLineInputFile part_1;
  Array2D<unsigned_int> sampleCount;
  InputFile part;
  Array2D<Imath_3_2::half_*> deepHData;
  Array2D<float_*> deepFData;
  Array2D<unsigned_int_*> deepUData;
  Array2D<Imath_3_2::half> hData;
  Array2D<float> fData;
  Array2D<unsigned_int> uData;
  FrameBuffer frameBuffer;
  undefined1 local_1e8 [8];
  int local_1e0;
  int local_1dc;
  undefined1 local_1d8 [24];
  _Base_ptr local_1c0;
  Array2D<unsigned_int> local_1b8;
  int local_198;
  int local_194;
  undefined1 local_190 [24];
  _Base_ptr local_178;
  Array2D<Imath_3_2::half_*> local_158;
  Array2D<float_*> local_138;
  Array2D<unsigned_int_*> local_118;
  Array2D<Imath_3_2::half> local_f8;
  Array2D<float> local_d8;
  Array2D<unsigned_int> local_b8;
  DeepFrameBuffer local_98;
  
  local_b8._sizeX = 0;
  local_b8._sizeY = 0;
  local_b8._data = (uint *)0x0;
  local_d8._data = (float *)0x0;
  local_d8._sizeX = 0;
  local_d8._sizeY = 0;
  local_f8._data = (half *)0x0;
  local_f8._sizeX = 0;
  local_f8._sizeY = 0;
  local_118._data = (uint **)0x0;
  local_118._sizeX = 0;
  local_118._sizeY = 0;
  local_138._data = (float **)0x0;
  local_138._sizeX = 0;
  local_138._sizeY = 0;
  local_158._data = (half **)0x0;
  local_158._sizeX = 0;
  local_158._sizeY = 0;
  local_1b8._data = (uint *)0x0;
  local_1b8._sizeX = 0;
  local_1b8._sizeY = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Reading first part ",0x13);
  std::ostream::flush();
  if (3 < *(anonymous_namespace)::partTypes) goto LAB_0017971c;
  pixelType = *(anonymous_namespace)::pixelTypes;
  switch(*(anonymous_namespace)::partTypes) {
  case 0:
    pcVar1 = (fn->_M_dataplus)._M_p;
    iVar4 = Imf_3_4::globalThreadCount();
    Imf_3_4::InputFile::InputFile((InputFile *)local_190,pcVar1,iVar4);
    iVar3 = random_int(0x10b);
    iVar5 = random_int(0x10b);
    iVar4 = iVar5;
    if (iVar3 < iVar5) {
      iVar4 = iVar3;
    }
    if (iVar5 < iVar3) {
      iVar5 = iVar3;
    }
    local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98._map._M_t._M_impl.super__Rb_tree_header._M_header;
    local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    setInputFrameBuffer((FrameBuffer *)&local_98,pixelType,&local_b8,&local_d8,&local_f8,0xc1,0x10b)
    ;
    Imf_3_4::InputFile::setFrameBuffer((FrameBuffer *)local_190);
    Imf_3_4::InputFile::readPixels((int)local_190,iVar4);
    if (pixelType == 0) {
      bVar2 = checkPixels<unsigned_int>(&local_b8,0,0xc0,iVar4,iVar5,0xc1);
      if (!bVar2) {
        __assert_fail("checkPixels<unsigned int> ( uData, 0, width - 1, l1, l2, width)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x450,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
    }
    else if (pixelType == 1) {
      bVar2 = checkPixels<float>(&local_d8,0,0xc0,iVar4,iVar5,0xc1);
      if (!bVar2) {
        __assert_fail("checkPixels<float> ( fData, 0, width - 1, l1, l2, width)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x454,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
    }
    else if ((pixelType == 2) &&
            (bVar2 = checkPixels<Imath_3_2::half>(&local_f8,0,0xc0,iVar4,iVar5,0xc1), !bVar2)) {
      __assert_fail("checkPixels<half> (hData, 0, width - 1, l1, l2, width)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                    ,0x458,"void (anonymous namespace)::readFirstPart(const std::string &)");
    }
    break;
  case 1:
    pcVar1 = (fn->_M_dataplus)._M_p;
    iVar4 = Imf_3_4::globalThreadCount();
    Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)local_190,pcVar1,iVar4);
    iVar4 = Imf_3_4::TiledInputFile::numXLevels();
    iVar5 = Imf_3_4::TiledInputFile::numYLevels();
    iVar6 = random_int(iVar4);
    random_int(iVar5);
    iVar7 = Imf_3_4::TiledInputFile::levelWidth((int)local_190);
    iVar8 = Imf_3_4::TiledInputFile::levelHeight((int)local_190);
    iVar4 = Imf_3_4::TiledInputFile::numXTiles((int)local_190);
    iVar3 = Imf_3_4::TiledInputFile::numYTiles((int)local_190);
    iVar9 = random_int(iVar4);
    iVar5 = random_int(iVar4);
    iVar10 = random_int(iVar3);
    iVar3 = random_int(iVar3);
    iVar4 = iVar5;
    if (iVar9 < iVar5) {
      iVar4 = iVar9;
    }
    if (iVar5 < iVar9) {
      iVar5 = iVar9;
    }
    iVar9 = iVar3;
    if (iVar10 < iVar3) {
      iVar9 = iVar10;
    }
    if (iVar3 < iVar10) {
      iVar3 = iVar10;
    }
    local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98._map._M_t._M_impl.super__Rb_tree_header._M_header;
    local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    setInputFrameBuffer((FrameBuffer *)&local_98,pixelType,&local_b8,&local_d8,&local_f8,iVar7,iVar8
                       );
    Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)local_190);
    Imf_3_4::TiledInputFile::readTiles((int)local_190,iVar4,iVar5,iVar9,iVar3,iVar6);
    Imf_3_4::TiledInputFile::dataWindowForTile((int)local_1d8,(int)local_190,iVar4,iVar9);
    Imf_3_4::TiledInputFile::dataWindowForTile((int)local_1e8,(int)local_190,iVar5,iVar3);
    if (pixelType == 0) {
      bVar2 = checkPixels<unsigned_int>
                        (&local_b8,local_1d8._0_4_,local_1e0,local_1d8._4_4_,local_1dc,iVar7);
      if (!bVar2) {
        __assert_fail("checkPixels<unsigned int> ( uData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x485,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
    }
    else if (pixelType == 1) {
      bVar2 = checkPixels<float>(&local_d8,local_1d8._0_4_,local_1e0,local_1d8._4_4_,local_1dc,iVar7
                                );
      if (!bVar2) {
        __assert_fail("checkPixels<float> ( fData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x489,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
    }
    else if ((pixelType == 2) &&
            (bVar2 = checkPixels<Imath_3_2::half>
                               (&local_f8,local_1d8._0_4_,local_1e0,local_1d8._4_4_,local_1dc,iVar7)
            , !bVar2)) {
      __assert_fail("checkPixels<half> ( hData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                    ,0x48d,"void (anonymous namespace)::readFirstPart(const std::string &)");
    }
    break;
  case 2:
    pcVar1 = (fn->_M_dataplus)._M_p;
    iVar4 = Imf_3_4::globalThreadCount();
    Imf_3_4::DeepScanLineInputFile::DeepScanLineInputFile
              ((DeepScanLineInputFile *)local_1d8,pcVar1,iVar4);
    local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98._map._M_t._M_impl.super__Rb_tree_header._M_header;
    local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Imf_3_4::Slice::Slice(&local_98._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
    puVar12 = (uint *)operator_new__(0x3252c);
    local_1b8._sizeX = (long)&DAT_0000010b;
    local_1b8._sizeY = 0xc1;
    local_1b8._data = puVar12;
    Imf_3_4::Slice::Slice((Slice *)local_190,UINT,(char *)puVar12,4,0x304,1,1,0.0,false,false);
    Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)&local_98);
    setInputDeepFrameBuffer(&local_98,pixelType,&local_118,&local_138,&local_158,0xc1,0x10b);
    Imf_3_4::DeepScanLineInputFile::setFrameBuffer((DeepFrameBuffer *)local_1d8);
    iVar3 = random_int(0x10b);
    iVar5 = random_int(0x10b);
    iVar4 = iVar5;
    if (iVar3 < iVar5) {
      iVar4 = iVar3;
    }
    if (iVar5 < iVar3) {
      iVar5 = iVar3;
    }
    Imf_3_4::DeepScanLineInputFile::readPixelSampleCounts((int)local_1d8,iVar4);
    bVar2 = checkSampleCount(&local_1b8,0,0xc0,iVar4,iVar5,0xc1);
    if (!bVar2) {
      __assert_fail("checkSampleCount (sampleCount, 0, width - 1, l1, l2, width)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                    ,0x4b1,"void (anonymous namespace)::readFirstPart(const std::string &)");
    }
    allocatePixels(pixelType,&local_1b8,&local_118,&local_138,&local_158,0,0xc0,iVar4,iVar5);
    Imf_3_4::DeepScanLineInputFile::readPixels((int)local_1d8,iVar4);
    if (pixelType == 2) {
      bVar2 = checkPixels<Imath_3_2::half>(&local_1b8,&local_158,0,0xc0,iVar4,iVar5,0xc1);
      if (!bVar2) {
        __assert_fail("checkPixels<half> ( sampleCount, deepHData, 0, width - 1, l1, l2, width)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x4cc,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
    }
    else if (pixelType == 1) {
      bVar2 = checkPixels<float>(&local_1b8,&local_138,0,0xc0,iVar4,iVar5,0xc1);
      if (!bVar2) {
        __assert_fail("checkPixels<float> ( sampleCount, deepFData, 0, width - 1, l1, l2, width)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x4c8,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
    }
    else if ((pixelType == 0) &&
            (bVar2 = checkPixels<unsigned_int>(&local_1b8,&local_118,0,0xc0,iVar4,iVar5,0xc1),
            !bVar2)) {
      __assert_fail("checkPixels<unsigned int> ( sampleCount, deepUData, 0, width - 1, l1, l2, width)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                    ,0x4c4,"void (anonymous namespace)::readFirstPart(const std::string &)");
    }
    local_190._0_4_ = 0;
    local_1e0 = 0xc0;
    local_190._4_4_ = iVar4;
    local_1dc = iVar5;
    goto LAB_001796e4;
  case 3:
    pcVar1 = (fn->_M_dataplus)._M_p;
    iVar4 = Imf_3_4::globalThreadCount();
    Imf_3_4::DeepTiledInputFile::DeepTiledInputFile((DeepTiledInputFile *)local_1d8,pcVar1,iVar4);
    iVar4 = Imf_3_4::DeepTiledInputFile::numXLevels();
    iVar5 = Imf_3_4::DeepTiledInputFile::numYLevels();
    iVar4 = random_int(iVar4);
    random_int(iVar5);
    iVar6 = Imf_3_4::DeepTiledInputFile::levelWidth((int)local_1d8);
    local_194 = Imf_3_4::DeepTiledInputFile::levelHeight((int)local_1d8);
    local_198 = iVar4;
    iVar4 = Imf_3_4::DeepTiledInputFile::numXTiles((int)local_1d8);
    iVar5 = Imf_3_4::DeepTiledInputFile::numYTiles((int)local_1d8);
    iVar7 = random_int(iVar4);
    iVar4 = random_int(iVar4);
    iVar8 = random_int(iVar5);
    iVar5 = random_int(iVar5);
    iVar3 = iVar4;
    if (iVar7 < iVar4) {
      iVar3 = iVar7;
    }
    if (iVar4 < iVar7) {
      iVar4 = iVar7;
    }
    iVar7 = iVar5;
    if (iVar8 < iVar5) {
      iVar7 = iVar8;
    }
    if (iVar5 < iVar8) {
      iVar5 = iVar8;
    }
    local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98._map._M_t._M_impl.super__Rb_tree_header._M_header;
    local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Imf_3_4::Slice::Slice(&local_98._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
    p_Var13 = (_Base_ptr)(long)local_194;
    sVar14 = (size_t)iVar6;
    uVar11 = (long)p_Var13 * sVar14;
    puVar12 = (uint *)operator_new__(-(ulong)(uVar11 >> 0x3e != 0) | uVar11 * 4);
    local_1b8._sizeX = (long)p_Var13;
    local_1b8._sizeY = sVar14;
    local_1b8._data = puVar12;
    Imf_3_4::Slice::Slice((Slice *)local_190,UINT,(char *)puVar12,4,sVar14 << 2,1,1,0.0,false,false)
    ;
    Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)&local_98);
    setInputDeepFrameBuffer(&local_98,pixelType,&local_118,&local_138,&local_158,iVar6,local_194);
    Imf_3_4::DeepTiledInputFile::setFrameBuffer((DeepFrameBuffer *)local_1d8);
    Imf_3_4::DeepTiledInputFile::readPixelSampleCounts
              ((int)local_1d8,iVar3,iVar4,iVar7,iVar5,local_198);
    iVar8 = local_198;
    Imf_3_4::DeepTiledInputFile::dataWindowForTile((int)local_190,(int)local_1d8,iVar3,iVar7);
    Imf_3_4::DeepTiledInputFile::dataWindowForTile((int)local_1e8,(int)local_1d8,iVar4,iVar5);
    bVar2 = checkSampleCount(&local_1b8,local_190._0_4_,local_1e0,local_190._4_4_,local_1dc,iVar6);
    if (!bVar2) {
      __assert_fail("checkSampleCount ( sampleCount, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                    ,0x506,"void (anonymous namespace)::readFirstPart(const std::string &)");
    }
    allocatePixels(pixelType,&local_1b8,&local_118,&local_138,&local_158,local_190._0_4_,local_1e0,
                   local_190._4_4_,local_1dc);
    Imf_3_4::DeepTiledInputFile::readTiles((int)local_1d8,iVar3,iVar4,iVar7,iVar5,iVar8);
    if (pixelType == 2) {
      bVar2 = checkPixels<Imath_3_2::half>
                        (&local_1b8,&local_158,local_190._0_4_,local_1e0,local_190._4_4_,local_1dc,
                         iVar6);
      if (!bVar2) {
        __assert_fail("checkPixels<half> ( sampleCount, deepHData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x533,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
    }
    else if (pixelType == 1) {
      bVar2 = checkPixels<float>(&local_1b8,&local_138,local_190._0_4_,local_1e0,local_190._4_4_,
                                 local_1dc,iVar6);
      if (!bVar2) {
        __assert_fail("checkPixels<float> ( sampleCount, deepFData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x529,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
    }
    else if ((pixelType == 0) &&
            (bVar2 = checkPixels<unsigned_int>
                               (&local_1b8,&local_118,local_190._0_4_,local_1e0,local_190._4_4_,
                                local_1dc,iVar6), !bVar2)) {
      __assert_fail("checkPixels<unsigned int> ( sampleCount, deepUData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                    ,0x51f,"void (anonymous namespace)::readFirstPart(const std::string &)");
    }
LAB_001796e4:
    releasePixels(pixelType,&local_118,&local_138,&local_158,local_190._0_4_,local_1e0,
                  local_190._4_4_,local_1dc);
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
                 *)&local_98);
    if (local_1c0 != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_);
    }
    operator_delete__(puVar12);
    goto LAB_0017971c;
  }
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
               *)&local_98);
  if (local_178 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_);
  }
LAB_0017971c:
  if (local_158._data != (half **)0x0) {
    operator_delete__(local_158._data);
  }
  if (local_138._data != (float **)0x0) {
    operator_delete__(local_138._data);
  }
  if (local_118._data != (uint **)0x0) {
    operator_delete__(local_118._data);
  }
  if (local_f8._data != (half *)0x0) {
    operator_delete__(local_f8._data);
  }
  if (local_d8._data != (float *)0x0) {
    operator_delete__(local_d8._data);
  }
  if (local_b8._data != (uint *)0x0) {
    operator_delete__(local_b8._data);
  }
  return;
}

Assistant:

void
readFirstPart (const std::string& fn)
{
    Array2D<unsigned int> uData;
    Array2D<float>        fData;
    Array2D<half>         hData;

    Array2D<unsigned int*> deepUData;
    Array2D<float*>        deepFData;
    Array2D<half*>         deepHData;

    Array2D<unsigned int> sampleCount;

    cout << "Reading first part " << flush;
    int pixelType = pixelTypes[0];
    int partType  = partTypes[0];
    int levelMode = levelModes[0];
    switch (partType)
    {
        case 0: {
            InputFile part (fn.c_str ());

            int l1, l2;
            l1 = random_int (height);
            l2 = random_int (height);
            if (l1 > l2) swap (l1, l2);

            FrameBuffer frameBuffer;
            setInputFrameBuffer (
                frameBuffer, pixelType, uData, fData, hData, width, height);

            part.setFrameBuffer (frameBuffer);
            part.readPixels (l1, l2);

            switch (pixelType)
            {
                case 0:
                    assert (checkPixels<unsigned int> (
                        uData, 0, width - 1, l1, l2, width));
                    break;
                case 1:
                    assert (checkPixels<float> (
                        fData, 0, width - 1, l1, l2, width));
                    break;
                case 2:
                    assert (
                        checkPixels<half> (hData, 0, width - 1, l1, l2, width));
                    break;
            }

            break;
        }
        case 1: {
            TiledInputFile part (fn.c_str ());

            int tx1, tx2, ty1, ty2;
            int lx, ly;

            int numXLevels = part.numXLevels ();
            int numYLevels = part.numYLevels ();

            lx = random_int (numXLevels);
            ly = random_int (numYLevels);
            if (levelMode == 1) ly = lx;

            int w = part.levelWidth (lx);
            int h = part.levelHeight (ly);

            int numXTiles = part.numXTiles (lx);
            int numYTiles = part.numYTiles (ly);
            tx1           = random_int (numXTiles);
            tx2           = random_int (numXTiles);
            ty1           = random_int (numYTiles);
            ty2           = random_int (numYTiles);
            if (tx1 > tx2) swap (tx1, tx2);
            if (ty1 > ty2) swap (ty1, ty2);

            FrameBuffer frameBuffer;
            setInputFrameBuffer (
                frameBuffer, pixelType, uData, fData, hData, w, h);

            part.setFrameBuffer (frameBuffer);
            part.readTiles (tx1, tx2, ty1, ty2, lx, ly);

            Box2i b1 = part.dataWindowForTile (tx1, ty1, lx, ly);
            Box2i b2 = part.dataWindowForTile (tx2, ty2, lx, ly);

            switch (pixelType)
            {
                case 0:
                    assert (checkPixels<unsigned int> (
                        uData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));
                    break;
                case 1:
                    assert (checkPixels<float> (
                        fData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));
                    break;
                case 2:
                    assert (checkPixels<half> (
                        hData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));
                    break;
            }

            break;
        }
        case 2: {
            DeepScanLineInputFile part (fn.c_str ());

            DeepFrameBuffer frameBuffer;

            sampleCount.resizeErase (height, width);
            frameBuffer.insertSampleCountSlice (Slice (
                OPENEXR_IMF_NAMESPACE::UINT,
                (char*) (&sampleCount[0][0]),
                sizeof (unsigned int) * 1,
                sizeof (unsigned int) * width));

            setInputDeepFrameBuffer (
                frameBuffer,
                pixelType,
                deepUData,
                deepFData,
                deepHData,
                width,
                height);

            part.setFrameBuffer (frameBuffer);

            int l1, l2;
            l1 = random_int (height);
            l2 = random_int (height);
            if (l1 > l2) swap (l1, l2);

            part.readPixelSampleCounts (l1, l2);
            assert (
                checkSampleCount (sampleCount, 0, width - 1, l1, l2, width));

            allocatePixels (
                pixelType,
                sampleCount,
                deepUData,
                deepFData,
                deepHData,
                0,
                width - 1,
                l1,
                l2);

            part.readPixels (l1, l2);

            switch (pixelType)
            {
                case 0:
                    assert (checkPixels<unsigned int> (
                        sampleCount, deepUData, 0, width - 1, l1, l2, width));
                    break;
                case 1:
                    assert (checkPixels<float> (
                        sampleCount, deepFData, 0, width - 1, l1, l2, width));
                    break;
                case 2:
                    assert (checkPixels<half> (
                        sampleCount, deepHData, 0, width - 1, l1, l2, width));
                    break;
            }

            releasePixels (
                pixelType,
                deepUData,
                deepFData,
                deepHData,
                0,
                width - 1,
                l1,
                l2);

            break;
        }
        case 3: {
            DeepTiledInputFile part (fn.c_str ());
            int                numXLevels = part.numXLevels ();
            int                numYLevels = part.numYLevels ();

            int tx1, tx2, ty1, ty2;
            int lx, ly;
            lx = random_int (numXLevels);
            ly = random_int (numYLevels);
            if (levelMode == 1) ly = lx;

            int w = part.levelWidth (lx);
            int h = part.levelHeight (ly);

            int numXTiles = part.numXTiles (lx);
            int numYTiles = part.numYTiles (ly);
            tx1           = random_int (numXTiles);
            tx2           = random_int (numXTiles);
            ty1           = random_int (numYTiles);
            ty2           = random_int (numYTiles);
            if (tx1 > tx2) swap (tx1, tx2);
            if (ty1 > ty2) swap (ty1, ty2);

            DeepFrameBuffer frameBuffer;

            sampleCount.resizeErase (h, w);
            frameBuffer.insertSampleCountSlice (Slice (
                IMF::UINT,
                (char*) (&sampleCount[0][0]),
                sizeof (unsigned int) * 1,
                sizeof (unsigned int) * w));

            setInputDeepFrameBuffer (
                frameBuffer, pixelType, deepUData, deepFData, deepHData, w, h);

            part.setFrameBuffer (frameBuffer);

            part.readPixelSampleCounts (tx1, tx2, ty1, ty2, lx, ly);

            Box2i b1 = part.dataWindowForTile (tx1, ty1, lx, ly);
            Box2i b2 = part.dataWindowForTile (tx2, ty2, lx, ly);
            assert (checkSampleCount (
                sampleCount, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));

            allocatePixels (
                pixelType,
                sampleCount,
                deepUData,
                deepFData,
                deepHData,
                b1.min.x,
                b2.max.x,
                b1.min.y,
                b2.max.y);

            part.readTiles (tx1, tx2, ty1, ty2, lx, ly);

            switch (pixelType)
            {
                case 0:
                    assert (checkPixels<unsigned int> (
                        sampleCount,
                        deepUData,
                        b1.min.x,
                        b2.max.x,
                        b1.min.y,
                        b2.max.y,
                        w));
                    break;
                case 1:
                    assert (checkPixels<float> (
                        sampleCount,
                        deepFData,
                        b1.min.x,
                        b2.max.x,
                        b1.min.y,
                        b2.max.y,
                        w));
                    break;
                case 2:
                    assert (checkPixels<half> (
                        sampleCount,
                        deepHData,
                        b1.min.x,
                        b2.max.x,
                        b1.min.y,
                        b2.max.y,
                        w));
                    break;
            }

            releasePixels (
                pixelType,
                deepUData,
                deepFData,
                deepHData,
                b1.min.x,
                b2.max.x,
                b1.min.y,
                b2.max.y);

            break;
        }
    }
}